

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwHideWindow(GLFWwindow *handle)

{
  _GLFWwindow *window;
  GLFWwindow *handle_local;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/window.c"
                  ,0x33c,"void glfwHideWindow(GLFWwindow *)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (*(long *)(handle + 0x50) == 0) {
    (*_glfw.platform.hideWindow)((_GLFWwindow *)handle);
  }
  return;
}

Assistant:

GLFWAPI void glfwHideWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfw.platform.hideWindow(window);
}